

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-replay.cpp
# Opt level: O2

bool __thiscall
replay_entry_t::match(replay_entry_t *this,ped_type_t type,__cilkrts_pedigree *node,int victim)

{
  long lVar1;
  
  if ((this->m_type == type) && ((type != ped_type_steal || (this->m_value == victim)))) {
    lVar1 = 0;
    while( true ) {
      if ((node == (__cilkrts_pedigree *)0x0) || (this->m_pedigree_len <= lVar1)) {
        return node == (__cilkrts_pedigree *)0x0 && this->m_pedigree_len == lVar1;
      }
      if (node->rank != this->m_reverse_pedigree[lVar1]) break;
      node = node->parent;
      lVar1 = lVar1 + 1;
    }
  }
  return false;
}

Assistant:

bool match (ped_type_t type, const __cilkrts_pedigree *node, int victim = -1)
    {
        int i = 0;

        // If the type isn't what they're seeking, we don't have a match
        if (type != m_type)
            return false;

        // If we're looking for a STEAL, then the victim must match
        if ((type == ped_type_steal) && (victim != m_value))
            return false;

        // Compare the current pedigree against what was recorded
        while ((NULL != node) && (i < m_pedigree_len))
        {
            // If we've got a pedigree rank difference, then we don't have
            // a match
            if (node->rank != m_reverse_pedigree[i])
                return false;
            node = node->parent;
            i++;
        }

        // Make sure we exhausted both the pedigree chain and the recorded
        // pedigree
        return ((NULL == node) && (i == m_pedigree_len));
    }